

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O0

void FT_Raccess_Guess(FT_Library library,FT_Stream stream,char *base_name,char **new_names,
                     FT_Long *offsets,FT_Error *errors)

{
  FT_Error FVar1;
  int local_3c;
  FT_Int i;
  FT_Error *errors_local;
  FT_Long *offsets_local;
  char **new_names_local;
  char *base_name_local;
  FT_Stream stream_local;
  FT_Library library_local;
  
  for (local_3c = 0; local_3c < 9; local_3c = local_3c + 1) {
    new_names[local_3c] = (char *)0x0;
    if (stream == (FT_Stream)0x0) {
      errors[local_3c] = 0;
    }
    else {
      FVar1 = FT_Stream_Seek(stream,0);
      errors[local_3c] = FVar1;
    }
    if (errors[local_3c] == 0) {
      FVar1 = (*ft_raccess_guess_table[local_3c].func)
                        (library,stream,base_name,new_names + local_3c,offsets + local_3c);
      errors[local_3c] = FVar1;
    }
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Raccess_Guess( FT_Library  library,
                    FT_Stream   stream,
                    char*       base_name,
                    char      **new_names,
                    FT_Long    *offsets,
                    FT_Error   *errors )
  {
    FT_Int  i;


    for ( i = 0; i < FT_RACCESS_N_RULES; i++ )
    {
      new_names[i] = NULL;
      if ( NULL != stream )
        errors[i] = FT_Stream_Seek( stream, 0 );
      else
        errors[i] = FT_Err_Ok;

      if ( errors[i] )
        continue;

      errors[i] = (FT_RACCESS_GUESS_TABLE_GET[i].func)( library,
                                                 stream, base_name,
                                                 &(new_names[i]),
                                                 &(offsets[i]) );
    }

    return;
  }